

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase_tests.cpp
# Opt level: O2

void __thiscall netbase_tests::netpermissions_test::test_method(netpermissions_test *this)

{
  long lVar1;
  bool bVar2;
  readonly_property65 rVar3;
  readonly_property<bool> rVar4;
  size_type sVar5;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var6;
  NetPermissionFlags flags;
  iterator in_R8;
  iterator pvVar7;
  iterator in_R9;
  iterator pvVar8;
  NetWhitebindPermissions *pNVar9;
  NetWhitebindPermissions *pNVar10;
  NetWhitelistPermissions *pNVar11;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar12;
  ConnectionDirection *pCVar13;
  char **ppcVar14;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string msg_24;
  const_string msg_25;
  const_string msg_26;
  const_string msg_27;
  const_string msg_28;
  const_string msg_29;
  const_string msg_30;
  const_string msg_31;
  const_string msg_32;
  const_string msg_33;
  const_string msg_34;
  const_string msg_35;
  const_string msg_36;
  const_string msg_37;
  const_string msg_38;
  const_string msg_39;
  const_string msg_40;
  const_string msg_41;
  const_string msg_42;
  const_string msg_43;
  const_string msg_44;
  const_string msg_45;
  const_string msg_46;
  const_string msg_47;
  const_string msg_48;
  const_string msg_49;
  const_string msg_50;
  const_string msg_51;
  const_string msg_52;
  const_string msg_53;
  const_string msg_54;
  const_string msg_55;
  const_string msg_56;
  const_string msg_57;
  const_string msg_58;
  const_string msg_59;
  const_string msg_60;
  const_string msg_61;
  const_string msg_62;
  const_string msg_63;
  const_string msg_64;
  const_string msg_65;
  const_string msg_66;
  const_string msg_67;
  const_string msg_68;
  const_string msg_69;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  const_string file_23;
  const_string file_24;
  const_string file_25;
  const_string file_26;
  const_string file_27;
  const_string file_28;
  const_string file_29;
  const_string file_30;
  const_string file_31;
  const_string file_32;
  const_string file_33;
  const_string file_34;
  const_string file_35;
  const_string file_36;
  const_string file_37;
  const_string file_38;
  const_string file_39;
  const_string file_40;
  const_string file_41;
  const_string file_42;
  const_string file_43;
  const_string file_44;
  const_string file_45;
  const_string file_46;
  const_string file_47;
  const_string file_48;
  const_string file_49;
  const_string file_50;
  const_string file_51;
  const_string file_52;
  const_string file_53;
  const_string file_54;
  const_string file_55;
  const_string file_56;
  const_string file_57;
  const_string file_58;
  const_string file_59;
  const_string file_60;
  const_string file_61;
  const_string file_62;
  const_string file_63;
  const_string file_64;
  const_string file_65;
  const_string file_66;
  const_string file_67;
  const_string file_68;
  const_string file_69;
  check_type cVar20;
  NetWhitebindPermissions *pNVar15;
  lazy_ostream *plVar16;
  lazy_ostream *plVar17;
  char *pcVar18;
  char **ppcVar19;
  char *local_f70;
  char *local_f68;
  undefined1 *local_f60;
  undefined1 *local_f58;
  char *local_f50;
  char *local_f48;
  char *local_f40;
  char *local_f38;
  undefined1 *local_f30;
  undefined1 *local_f28;
  char *local_f20;
  char *local_f18;
  char *local_f10;
  char *local_f08;
  undefined1 *local_f00;
  undefined1 *local_ef8;
  char *local_ef0;
  char *local_ee8;
  char *local_ee0;
  char *local_ed8;
  undefined1 *local_ed0;
  undefined1 *local_ec8;
  char *local_ec0;
  char *local_eb8;
  char *local_eb0;
  char *local_ea8;
  undefined1 *local_ea0;
  undefined1 *local_e98;
  char *local_e90;
  char *local_e88;
  char *local_e80;
  char *local_e78;
  undefined1 *local_e70;
  undefined1 *local_e68;
  char *local_e60;
  char *local_e58;
  char *local_e50;
  char *local_e48;
  undefined1 *local_e40;
  undefined1 *local_e38;
  char *local_e30;
  char *local_e28;
  char *local_e20;
  char *local_e18;
  undefined1 *local_e10;
  undefined1 *local_e08;
  char *local_e00;
  char *local_df8;
  char *local_df0;
  char *local_de8;
  undefined1 *local_de0;
  undefined1 *local_dd8;
  char *local_dd0;
  char *local_dc8;
  char *local_dc0;
  char *local_db8;
  undefined1 *local_db0;
  undefined1 *local_da8;
  char *local_da0;
  char *local_d98;
  char *local_d90;
  char *local_d88;
  undefined1 *local_d80;
  undefined1 *local_d78;
  char *local_d70;
  char *local_d68;
  char *local_d60;
  char *local_d58;
  undefined1 *local_d50;
  undefined1 *local_d48;
  char *local_d40;
  char *local_d38;
  char *local_d30;
  char *local_d28;
  undefined1 *local_d20;
  undefined1 *local_d18;
  char *local_d10;
  char *local_d08;
  char *local_d00;
  char *local_cf8;
  undefined1 *local_cf0;
  undefined1 *local_ce8;
  char *local_ce0;
  char *local_cd8;
  char *local_cd0;
  char *local_cc8;
  undefined1 *local_cc0;
  undefined1 *local_cb8;
  char *local_cb0;
  char *local_ca8;
  char *local_ca0;
  char *local_c98;
  undefined1 *local_c90;
  undefined1 *local_c88;
  char *local_c80;
  char *local_c78;
  char *local_c70;
  char *local_c68;
  undefined1 *local_c60;
  undefined1 *local_c58;
  char *local_c50;
  char *local_c48;
  char *local_c40;
  char *local_c38;
  undefined1 *local_c30;
  undefined1 *local_c28;
  char *local_c20;
  char *local_c18;
  char *local_c10;
  char *local_c08;
  undefined1 *local_c00;
  undefined1 *local_bf8;
  char *local_bf0;
  char *local_be8;
  char *local_be0;
  char *local_bd8;
  undefined1 *local_bd0;
  undefined1 *local_bc8;
  char *local_bc0;
  char *local_bb8;
  char *local_bb0;
  char *local_ba8;
  undefined1 *local_ba0;
  undefined1 *local_b98;
  char *local_b90;
  char *local_b88;
  char *local_b80;
  char *local_b78;
  undefined1 *local_b70;
  undefined1 *local_b68;
  char *local_b60;
  char *local_b58;
  char *local_b50;
  char *local_b48;
  undefined1 *local_b40;
  undefined1 *local_b38;
  char *local_b30;
  char *local_b28;
  char *local_b20;
  char *local_b18;
  undefined1 *local_b10;
  undefined1 *local_b08;
  char *local_b00;
  char *local_af8;
  char *local_af0;
  char *local_ae8;
  undefined1 *local_ae0;
  undefined1 *local_ad8;
  char *local_ad0;
  char *local_ac8;
  char *local_ac0;
  char *local_ab8;
  undefined1 *local_ab0;
  undefined1 *local_aa8;
  char *local_aa0;
  char *local_a98;
  char *local_a90;
  char *local_a88;
  undefined1 *local_a80;
  undefined1 *local_a78;
  char *local_a70;
  char *local_a68;
  char *local_a60;
  char *local_a58;
  undefined1 *local_a50;
  undefined1 *local_a48;
  char *local_a40;
  char *local_a38;
  char *local_a30;
  char *local_a28;
  undefined1 *local_a20;
  undefined1 *local_a18;
  char *local_a10;
  char *local_a08;
  char *local_a00;
  char *local_9f8;
  undefined1 *local_9f0;
  undefined1 *local_9e8;
  char *local_9e0;
  char *local_9d8;
  char *local_9d0;
  char *local_9c8;
  undefined1 *local_9c0;
  undefined1 *local_9b8;
  char *local_9b0;
  char *local_9a8;
  char *local_9a0;
  char *local_998;
  undefined1 *local_990;
  undefined1 *local_988;
  char *local_980;
  char *local_978;
  char *local_970;
  char *local_968;
  undefined1 *local_960;
  undefined1 *local_958;
  char *local_950;
  char *local_948;
  char *local_940;
  char *local_938;
  undefined1 *local_930;
  undefined1 *local_928;
  char *local_920;
  char *local_918;
  char *local_910;
  char *local_908;
  undefined1 *local_900;
  undefined1 *local_8f8;
  char *local_8f0;
  char *local_8e8;
  char *local_8e0;
  char *local_8d8;
  undefined1 *local_8d0;
  undefined1 *local_8c8;
  char *local_8c0;
  char *local_8b8;
  char *local_8b0;
  char *local_8a8;
  undefined1 *local_8a0;
  undefined1 *local_898;
  char *local_890;
  char *local_888;
  char *local_880;
  char *local_878;
  undefined1 *local_870;
  undefined1 *local_868;
  char *local_860;
  char *local_858;
  char *local_850;
  char *local_848;
  undefined1 *local_840;
  undefined1 *local_838;
  char *local_830;
  char *local_828;
  char *local_820;
  char *local_818;
  undefined1 *local_810;
  undefined1 *local_808;
  char *local_800;
  char *local_7f8;
  char *local_7f0;
  char *local_7e8;
  undefined1 *local_7e0;
  undefined1 *local_7d8;
  char *local_7d0;
  char *local_7c8;
  char *local_7c0;
  char *local_7b8;
  undefined1 *local_7b0;
  undefined1 *local_7a8;
  char *local_7a0;
  char *local_798;
  char *local_790;
  char *local_788;
  undefined1 *local_780;
  undefined1 *local_778;
  char *local_770;
  char *local_768;
  char *local_760;
  char *local_758;
  undefined1 *local_750;
  undefined1 *local_748;
  char *local_740;
  char *local_738;
  char *local_730;
  char *local_728;
  undefined1 *local_720;
  undefined1 *local_718;
  char *local_710;
  char *local_708;
  char *local_700;
  char *local_6f8;
  undefined1 *local_6f0;
  undefined1 *local_6e8;
  char *local_6e0;
  char *local_6d8;
  char *local_6d0;
  char *local_6c8;
  undefined1 *local_6c0;
  undefined1 *local_6b8;
  char *local_6b0;
  char *local_6a8;
  char *local_6a0;
  char *local_698;
  undefined1 *local_690;
  undefined1 *local_688;
  char *local_680;
  char *local_678;
  char *local_670;
  char *local_668;
  undefined1 *local_660;
  undefined1 *local_658;
  char *local_650;
  char *local_648;
  char *local_640;
  char *local_638;
  undefined1 *local_630;
  undefined1 *local_628;
  char *local_620;
  char *local_618;
  char *local_610;
  char *local_608;
  undefined1 *local_600;
  undefined1 *local_5f8;
  char *local_5f0;
  char *local_5e8;
  char *local_5e0;
  char *local_5d8;
  undefined1 *local_5d0;
  undefined1 *local_5c8;
  char *local_5c0;
  char *local_5b8;
  char *local_5b0;
  char *local_5a8;
  undefined1 *local_5a0;
  undefined1 *local_598;
  char *local_590;
  char *local_588;
  char *local_580;
  char *local_578;
  undefined1 *local_570;
  undefined1 *local_568;
  char *local_560;
  char *local_558;
  char *local_550;
  char *local_548;
  char *local_540;
  char *local_538;
  allocator<char> local_529;
  assertion_result local_528;
  undefined1 *local_510;
  undefined1 *local_508;
  char *local_500;
  char *local_4f8;
  char *local_4f0;
  char *local_4e8;
  undefined1 *local_4e0;
  undefined1 *local_4d8;
  char *local_4d0;
  char *local_4c8;
  char *local_4c0;
  char *local_4b8;
  undefined1 *local_4b0;
  undefined1 *local_4a8;
  char *local_4a0;
  char *local_498;
  char *local_490;
  char *local_488;
  undefined1 *local_480;
  undefined1 *local_478;
  char *local_470;
  char *local_468;
  char *local_460;
  char *local_458;
  undefined1 *local_450;
  undefined1 *local_448;
  char *local_440;
  char *local_438;
  char *local_430;
  char *local_428;
  undefined1 *local_420;
  undefined1 *local_418;
  char *local_410;
  char *local_408;
  char *local_400;
  char *local_3f8;
  undefined1 *local_3f0;
  undefined1 *local_3e8;
  char *local_3e0;
  char *local_3d8;
  char *local_3d0;
  char *local_3c8;
  undefined1 *local_3c0;
  undefined1 *local_3b8;
  char *local_3b0;
  char *local_3a8;
  char *local_3a0;
  char *local_398;
  undefined1 *local_390;
  undefined1 *local_388;
  char *local_380;
  char *local_378;
  char *local_370;
  char *local_368;
  undefined1 *local_360;
  undefined1 *local_358;
  char *local_350;
  char *local_348;
  char *local_340;
  char *local_338;
  undefined1 *local_330;
  undefined1 *local_328;
  char *local_320;
  char *local_318;
  char *local_310;
  char *local_308;
  undefined1 *local_300;
  undefined1 *local_2f8;
  char *local_2f0;
  char *local_2e8;
  char *local_2e0;
  char *local_2d8;
  undefined1 *local_2d0;
  undefined1 *local_2c8;
  char *local_2c0;
  char *local_2b8;
  char *local_2b0;
  char *local_2a8;
  undefined1 *local_2a0;
  undefined1 *local_298;
  char *local_290;
  char *local_288;
  char *local_280;
  char *local_278;
  undefined1 *local_270;
  undefined1 *local_268;
  char *local_260;
  char *local_258;
  char *local_250;
  char *local_248;
  undefined1 *local_240;
  undefined1 *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  undefined1 *local_210;
  undefined1 *local_208;
  char *local_200;
  char *local_1f8;
  ConnectionDirection connection_direction;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  strings;
  undefined1 local_1c8 [16];
  undefined1 *local_1b8;
  undefined8 local_1b0;
  NetWhitebindPermissions download;
  NetWhitebindPermissions download_noban;
  NetWhitebindPermissions noban_download;
  NetWhitebindPermissions noban;
  NetWhitelistPermissions whitelistPermissions;
  NetWhitebindPermissions whitebindPermissions;
  bilingual_str error;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  error.original._M_dataplus._M_p = (pointer)&error.original.field_2;
  error.original._M_string_length = 0;
  error.original.field_2._M_local_buf[0] = '\0';
  error.translated._M_dataplus._M_p = (pointer)&error.translated.field_2;
  error.translated._M_string_length = 0;
  error.translated.field_2._M_local_buf[0] = '\0';
  CService::CService(&whitebindPermissions.m_service);
  CSubNet::CSubNet(&whitelistPermissions.m_subnet);
  local_200 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_1f8 = "";
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x174;
  file.m_begin = (iterator)&local_200;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_210,msg);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&noban,"",(allocator<char> *)local_1c8);
  bVar2 = NetWhitebindPermissions::TryParse((string *)&noban,&whitebindPermissions,&error);
  download_noban.super_NetPermissions.m_flags._0_1_ = !bVar2;
  download_noban.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
  download_noban.m_service.super_CNetAddr.m_addr._union._8_8_ = 0;
  noban_download.m_service.super_CNetAddr.m_addr._16_8_ = &download;
  download._0_8_ = anon_var_dwarf_b5775e;
  download.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect = "";
  noban_download.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)((ulong)noban_download.m_service.super_CNetAddr.m_addr._union.indirect_contents.
                       indirect & 0xffffffffffffff00);
  noban_download._0_8_ = &PTR__lazy_ostream_0113a070;
  noban_download.m_service.super_CNetAddr.m_addr._union._8_8_ = boost::unit_test::lazy_ostream::inst
  ;
  local_220 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_218 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&download_noban,(lazy_ostream *)&noban_download,1,0,WARN,_cVar20,
             (size_t)&local_220,0x174);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&download_noban.m_service.super_CNetAddr.m_addr._union + 8));
  std::__cxx11::string::~string((string *)&noban);
  local_230 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_228 = "";
  local_240 = &boost::unit_test::basic_cstring<char_const>::null;
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = pvVar8;
  msg_00.m_begin = pvVar7;
  file_00.m_end = (iterator)0x175;
  file_00.m_begin = (iterator)&local_230;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_240,
             msg_00);
  sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    (&error.original,"Cannot resolve -whitebind address",0);
  noban_download.super_NetPermissions.m_flags._0_1_ = sVar5 != 0xffffffffffffffff;
  noban_download.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
  noban_download.m_service.super_CNetAddr.m_addr._union._8_8_ = 0;
  download_noban._0_8_ = anon_var_dwarf_b57778;
  download_noban.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect = "";
  noban.m_service.super_CNetAddr.m_addr._union.direct[0] = '\0';
  noban._0_8_ = &PTR__lazy_ostream_0113a070;
  noban.m_service.super_CNetAddr.m_addr._union._8_8_ = boost::unit_test::lazy_ostream::inst;
  local_250 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_248 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  noban.m_service.super_CNetAddr.m_addr._16_8_ = &download_noban;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&noban_download,(lazy_ostream *)&noban,1,0,WARN,_cVar20,
             (size_t)&local_250,0x175);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&noban_download.m_service.super_CNetAddr.m_addr._union + 8));
  local_260 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_258 = "";
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = pvVar8;
  msg_01.m_begin = pvVar7;
  file_01.m_end = (iterator)0x176;
  file_01.m_begin = (iterator)&local_260;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_270,
             msg_01);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&noban,"127.0.0.1",(allocator<char> *)local_1c8);
  bVar2 = NetWhitebindPermissions::TryParse((string *)&noban,&whitebindPermissions,&error);
  download_noban.super_NetPermissions.m_flags._0_1_ = !bVar2;
  download_noban.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
  download_noban.m_service.super_CNetAddr.m_addr._union._8_8_ = 0;
  download._0_8_ = anon_var_dwarf_b57793;
  download.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect = "";
  noban_download.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)((ulong)noban_download.m_service.super_CNetAddr.m_addr._union.indirect_contents.
                       indirect & 0xffffffffffffff00);
  noban_download._0_8_ = &PTR__lazy_ostream_0113a070;
  noban_download.m_service.super_CNetAddr.m_addr._union._8_8_ = boost::unit_test::lazy_ostream::inst
  ;
  noban_download.m_service.super_CNetAddr.m_addr._16_8_ = &download;
  local_280 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_278 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&download_noban,(lazy_ostream *)&noban_download,1,0,WARN,_cVar20,
             (size_t)&local_280,0x176);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&download_noban.m_service.super_CNetAddr.m_addr._union + 8));
  std::__cxx11::string::~string((string *)&noban);
  local_290 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_288 = "";
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = pvVar8;
  msg_02.m_begin = pvVar7;
  file_02.m_end = (iterator)0x177;
  file_02.m_begin = (iterator)&local_290;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_2a0,
             msg_02);
  sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    (&error.original,"Need to specify a port with -whitebind",0);
  noban_download.super_NetPermissions.m_flags._0_1_ = sVar5 != 0xffffffffffffffff;
  noban_download.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
  noban_download.m_service.super_CNetAddr.m_addr._union._8_8_ = 0;
  download_noban._0_8_ = anon_var_dwarf_b577bb;
  download_noban.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect = "";
  noban.m_service.super_CNetAddr.m_addr._union.direct[0] = '\0';
  noban._0_8_ = &PTR__lazy_ostream_0113a070;
  noban.m_service.super_CNetAddr.m_addr._union._8_8_ = boost::unit_test::lazy_ostream::inst;
  local_2b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_2a8 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  noban.m_service.super_CNetAddr.m_addr._16_8_ = &download_noban;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&noban_download,(lazy_ostream *)&noban,1,0,WARN,_cVar20,
             (size_t)&local_2b0,0x177);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&noban_download.m_service.super_CNetAddr.m_addr._union + 8));
  local_2c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_2b8 = "";
  local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = pvVar8;
  msg_03.m_begin = pvVar7;
  file_03.m_end = (iterator)0x178;
  file_03.m_begin = (iterator)&local_2c0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_2d0,
             msg_03);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&noban,"",(allocator<char> *)local_1c8);
  bVar2 = NetWhitebindPermissions::TryParse((string *)&noban,&whitebindPermissions,&error);
  download_noban.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
  download_noban.m_service.super_CNetAddr.m_addr._union._8_8_ = 0;
  download._0_8_ = anon_var_dwarf_b5775e;
  download.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect = "";
  noban_download.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)((ulong)noban_download.m_service.super_CNetAddr.m_addr._union.indirect_contents.
                       indirect & 0xffffffffffffff00);
  noban_download._0_8_ = &PTR__lazy_ostream_0113a070;
  noban_download.m_service.super_CNetAddr.m_addr._union._8_8_ = boost::unit_test::lazy_ostream::inst
  ;
  noban_download.m_service.super_CNetAddr.m_addr._16_8_ = &download;
  local_2e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_2d8 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  download_noban.super_NetPermissions.m_flags._0_1_ = !bVar2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&download_noban,(lazy_ostream *)&noban_download,1,0,WARN,_cVar20,
             (size_t)&local_2e0,0x178);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&download_noban.m_service.super_CNetAddr.m_addr._union + 8));
  std::__cxx11::string::~string((string *)&noban);
  local_2f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_2e8 = "";
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_04.m_end = pvVar8;
  msg_04.m_begin = pvVar7;
  file_04.m_end = (iterator)0x17b;
  file_04.m_begin = (iterator)&local_2f0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_300,
             msg_04);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&noban,"1.2.3.4:32",(allocator<char> *)local_1c8);
  download_noban.super_NetPermissions.m_flags._0_1_ =
       NetWhitebindPermissions::TryParse((string *)&noban,&whitebindPermissions,&error);
  download_noban.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
  download_noban.m_service.super_CNetAddr.m_addr._union._8_8_ = 0;
  download._0_8_ = anon_var_dwarf_b577e3;
  download.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect = "";
  noban_download.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)((ulong)noban_download.m_service.super_CNetAddr.m_addr._union.indirect_contents.
                       indirect & 0xffffffffffffff00);
  noban_download._0_8_ = &PTR__lazy_ostream_0113a070;
  noban_download.m_service.super_CNetAddr.m_addr._union._8_8_ = boost::unit_test::lazy_ostream::inst
  ;
  noban_download.m_service.super_CNetAddr.m_addr._16_8_ = &download;
  local_310 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_308 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&download_noban,(lazy_ostream *)&noban_download,1,0,WARN,_cVar20,
             (size_t)&local_310,0x17b);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&download_noban.m_service.super_CNetAddr.m_addr._union + 8));
  std::__cxx11::string::~string((string *)&noban);
  local_320 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_318 = "";
  local_330 = &boost::unit_test::basic_cstring<char_const>::null;
  local_328 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_05.m_end = pvVar8;
  msg_05.m_begin = pvVar7;
  file_05.m_end = (iterator)0x17c;
  file_05.m_begin = (iterator)&local_320;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_330,
             msg_05);
  pNVar10 = &noban_download;
  noban_download.super_NetPermissions.m_flags._0_1_ = error.original._M_string_length == 0;
  noban_download.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
  noban_download.m_service.super_CNetAddr.m_addr._union._8_8_ = 0;
  download_noban._0_8_ = (long)"!error.empty()" + 1;
  download_noban.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect = "";
  noban.m_service.super_CNetAddr.m_addr._union.direct[0] = '\0';
  noban._0_8_ = &PTR__lazy_ostream_0113a070;
  noban.m_service.super_CNetAddr.m_addr._union._8_8_ = boost::unit_test::lazy_ostream::inst;
  local_340 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_338 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  noban.m_service.super_CNetAddr.m_addr._16_8_ = &download_noban;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)pNVar10,(lazy_ostream *)&noban,1,0,WARN,_cVar20,(size_t)&local_340,
             0x17c);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&noban_download.m_service.super_CNetAddr.m_addr._union + 8));
  local_350 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_348 = "";
  local_360 = &boost::unit_test::basic_cstring<char_const>::null;
  local_358 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_06.m_end = pvVar8;
  msg_06.m_begin = pvVar7;
  file_06.m_end = (iterator)0x17d;
  file_06.m_begin = (iterator)&local_350;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_360,
             msg_06);
  noban.m_service.super_CNetAddr.m_addr._union.direct[0] = '\0';
  noban._0_8_ = &PTR__lazy_ostream_01139f30;
  noban.m_service.super_CNetAddr.m_addr._union._8_8_ = boost::unit_test::lazy_ostream::inst;
  noban.m_service.super_CNetAddr.m_addr._16_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_370 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_368 = "";
  noban_download.super_NetPermissions.m_flags = Implicit;
  pvVar7 = (iterator)0x2;
  pNVar9 = &whitebindPermissions;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,NetPermissionFlags,NetPermissionFlags>
            (&noban,&local_370,0x17d,1,2,pNVar9,"whitebindPermissions.m_flags",pNVar10,
             "NetPermissionFlags::Implicit");
  local_380 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_378 = "";
  local_390 = &boost::unit_test::basic_cstring<char_const>::null;
  local_388 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_07.m_end = (iterator)pNVar9;
  msg_07.m_begin = pvVar7;
  file_07.m_end = (iterator)0x17e;
  file_07.m_begin = (iterator)&local_380;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_390,
             msg_07);
  noban_download.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
  noban_download.m_service.super_CNetAddr.m_addr._union._8_8_ = 0;
  download_noban._0_8_ =
       (long)"!NetPermissions::HasFlag(whitebindPermissions.m_flags, NetPermissionFlags::Implicit)"
       + 1;
  download_noban.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect = "";
  noban.m_service.super_CNetAddr.m_addr._union.direct[0] = '\0';
  noban._0_8_ = &PTR__lazy_ostream_0113a070;
  noban.m_service.super_CNetAddr.m_addr._union._8_8_ = boost::unit_test::lazy_ostream::inst;
  local_3a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_398 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  noban.m_service.super_CNetAddr.m_addr._16_8_ = &download_noban;
  noban_download.super_NetPermissions.m_flags._0_1_ =
       (char)(whitebindPermissions.super_NetPermissions.m_flags >> 0x1f);
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&noban_download,(lazy_ostream *)&noban,1,0,WARN,(check_type)pNVar10
             ,(size_t)&local_3a0,0x17e);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&noban_download.m_service.super_CNetAddr.m_addr._union + 8));
  whitebindPermissions.super_NetPermissions.m_flags =
       whitebindPermissions.super_NetPermissions.m_flags & ~Implicit;
  local_3b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_3a8 = "";
  local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3b8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_08.m_end = pvVar8;
  msg_08.m_begin = pvVar7;
  file_08.m_end = (iterator)0x180;
  file_08.m_begin = (iterator)&local_3b0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_3c0,
             msg_08);
  pNVar9 = &noban_download;
  noban_download.super_NetPermissions.m_flags._0_1_ =
       -1 < (int)whitebindPermissions.super_NetPermissions.m_flags;
  noban_download.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
  noban_download.m_service.super_CNetAddr.m_addr._union._8_8_ = 0;
  download_noban._0_8_ = anon_var_dwarf_b57832;
  download_noban.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect = "";
  noban.m_service.super_CNetAddr.m_addr._union.direct[0] = '\0';
  noban._0_8_ = &PTR__lazy_ostream_0113a070;
  noban.m_service.super_CNetAddr.m_addr._union._8_8_ = boost::unit_test::lazy_ostream::inst;
  local_3d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_3c8 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  noban.m_service.super_CNetAddr.m_addr._16_8_ = &download_noban;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)pNVar9,(lazy_ostream *)&noban,1,0,WARN,(check_type)pNVar10,
             (size_t)&local_3d0,0x180);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&noban_download.m_service.super_CNetAddr.m_addr._union + 8));
  local_3e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_3d8 = "";
  local_3f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3e8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_09.m_end = pvVar8;
  msg_09.m_begin = pvVar7;
  file_09.m_end = (iterator)0x181;
  file_09.m_begin = (iterator)&local_3e0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_3f0,
             msg_09);
  noban.m_service.super_CNetAddr.m_addr._union.direct[0] = '\0';
  noban._0_8_ = &PTR__lazy_ostream_01139f30;
  noban.m_service.super_CNetAddr.m_addr._union._8_8_ = boost::unit_test::lazy_ostream::inst;
  noban.m_service.super_CNetAddr.m_addr._16_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_400 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_3f8 = "";
  noban_download._0_8_ = noban_download._0_8_ & 0xffffffff00000000;
  pvVar7 = (iterator)0x2;
  pNVar10 = &whitebindPermissions;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,NetPermissionFlags,NetPermissionFlags>
            (&noban,&local_400,0x181,1,2,pNVar10,"whitebindPermissions.m_flags",pNVar9,
             "NetPermissionFlags::None");
  whitebindPermissions.super_NetPermissions.m_flags =
       whitebindPermissions.super_NetPermissions.m_flags | Implicit;
  local_410 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_408 = "";
  local_420 = &boost::unit_test::basic_cstring<char_const>::null;
  local_418 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_10.m_end = (iterator)pNVar10;
  msg_10.m_begin = pvVar7;
  file_10.m_end = (iterator)0x183;
  file_10.m_begin = (iterator)&local_410;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_420,
             msg_10);
  noban_download.super_NetPermissions.m_flags._0_1_ =
       (byte)(whitebindPermissions.super_NetPermissions.m_flags >> 0x1f);
  noban_download.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
  noban_download.m_service.super_CNetAddr.m_addr._union._8_8_ = 0;
  download_noban._0_8_ =
       (long)"!NetPermissions::HasFlag(whitebindPermissions.m_flags, NetPermissionFlags::Implicit)"
       + 1;
  download_noban.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect = "";
  noban.m_service.super_CNetAddr.m_addr._union.direct[0] = '\0';
  noban._0_8_ = &PTR__lazy_ostream_0113a070;
  noban.m_service.super_CNetAddr.m_addr._union._8_8_ = boost::unit_test::lazy_ostream::inst;
  local_430 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_428 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  noban.m_service.super_CNetAddr.m_addr._16_8_ = &download_noban;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&noban_download,(lazy_ostream *)&noban,1,0,WARN,(check_type)pNVar9,
             (size_t)&local_430,0x183);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&noban_download.m_service.super_CNetAddr.m_addr._union + 8));
  local_440 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_438 = "";
  local_450 = &boost::unit_test::basic_cstring<char_const>::null;
  local_448 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_11.m_end = pvVar8;
  msg_11.m_begin = pvVar7;
  file_11.m_end = (iterator)0x186;
  file_11.m_begin = (iterator)&local_440;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_450,
             msg_11);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&noban,"bloom@1.2.3.4:32",(allocator<char> *)local_1c8);
  bVar2 = NetWhitebindPermissions::TryParse((string *)&noban,&whitebindPermissions,&error);
  download_noban.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
  download_noban.m_service.super_CNetAddr.m_addr._union._8_8_ = 0;
  download._0_8_ = anon_var_dwarf_b57867;
  download.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect = "";
  pNVar10 = &noban_download;
  noban_download.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)((ulong)noban_download.m_service.super_CNetAddr.m_addr._union.indirect_contents.
                       indirect & 0xffffffffffffff00);
  noban_download._0_8_ = &PTR__lazy_ostream_0113a070;
  noban_download.m_service.super_CNetAddr.m_addr._union._8_8_ = boost::unit_test::lazy_ostream::inst
  ;
  noban_download.m_service.super_CNetAddr.m_addr._16_8_ = &download;
  local_460 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_458 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  download_noban.super_NetPermissions.m_flags._0_1_ = bVar2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&download_noban,(lazy_ostream *)pNVar10,1,0,WARN,(check_type)pNVar9
             ,(size_t)&local_460,0x186);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&download_noban.m_service.super_CNetAddr.m_addr._union + 8));
  std::__cxx11::string::~string((string *)&noban);
  local_470 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_468 = "";
  local_480 = &boost::unit_test::basic_cstring<char_const>::null;
  local_478 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_12.m_end = pvVar8;
  msg_12.m_begin = pvVar7;
  file_12.m_end = (iterator)0x187;
  file_12.m_begin = (iterator)&local_470;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_480,
             msg_12);
  noban.m_service.super_CNetAddr.m_addr._union.direct[0] = '\0';
  noban._0_8_ = &PTR__lazy_ostream_01139f30;
  noban.m_service.super_CNetAddr.m_addr._union._8_8_ = boost::unit_test::lazy_ostream::inst;
  noban.m_service.super_CNetAddr.m_addr._16_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_490 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_488 = "";
  noban_download.super_NetPermissions.m_flags = BloomFilter;
  pvVar7 = (iterator)0x2;
  pNVar9 = &whitebindPermissions;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,NetPermissionFlags,NetPermissionFlags>
            (&noban,&local_490,0x187,1,2,pNVar9,"whitebindPermissions.m_flags",pNVar10,
             "NetPermissionFlags::BloomFilter");
  local_4a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_498 = "";
  local_4b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4a8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_13.m_end = (iterator)pNVar9;
  msg_13.m_begin = pvVar7;
  file_13.m_end = (iterator)0x188;
  file_13.m_begin = (iterator)&local_4a0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_4b0,
             msg_13);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&noban,"@1.2.3.4:32",(allocator<char> *)local_1c8);
  download_noban.super_NetPermissions.m_flags._0_1_ =
       NetWhitebindPermissions::TryParse((string *)&noban,&whitebindPermissions,&error);
  download_noban.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
  download_noban.m_service.super_CNetAddr.m_addr._union._8_8_ = 0;
  download._0_8_ = anon_var_dwarf_b5788e;
  download.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect = "";
  pNVar9 = &noban_download;
  noban_download.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)((ulong)noban_download.m_service.super_CNetAddr.m_addr._union.indirect_contents.
                       indirect & 0xffffffffffffff00);
  noban_download._0_8_ = &PTR__lazy_ostream_0113a070;
  noban_download.m_service.super_CNetAddr.m_addr._union._8_8_ = boost::unit_test::lazy_ostream::inst
  ;
  noban_download.m_service.super_CNetAddr.m_addr._16_8_ = &download;
  local_4c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_4b8 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&download_noban,(lazy_ostream *)pNVar9,1,0,WARN,(check_type)pNVar10
             ,(size_t)&local_4c0,0x188);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&download_noban.m_service.super_CNetAddr.m_addr._union + 8));
  std::__cxx11::string::~string((string *)&noban);
  local_4d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_4c8 = "";
  local_4e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4d8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_14.m_end = pvVar8;
  msg_14.m_begin = pvVar7;
  file_14.m_end = (iterator)0x189;
  file_14.m_begin = (iterator)&local_4d0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_4e0,
             msg_14);
  noban.m_service.super_CNetAddr.m_addr._union.direct[0] = '\0';
  noban._0_8_ = &PTR__lazy_ostream_01139f30;
  noban.m_service.super_CNetAddr.m_addr._union._8_8_ = boost::unit_test::lazy_ostream::inst;
  noban.m_service.super_CNetAddr.m_addr._16_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_4f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_4e8 = "";
  noban_download._0_8_ = noban_download._0_8_ & 0xffffffff00000000;
  pvVar7 = (iterator)0x2;
  pNVar10 = &whitebindPermissions;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,NetPermissionFlags,NetPermissionFlags>
            (&noban,&local_4f0,0x189,1,2,pNVar10,"whitebindPermissions.m_flags",pNVar9,
             "NetPermissionFlags::None");
  CService::CService(&noban.m_service);
  CService::CService(&noban_download.m_service);
  CService::CService(&download_noban.m_service);
  CService::CService(&download.m_service);
  local_500 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_4f8 = "";
  local_510 = &boost::unit_test::basic_cstring<char_const>::null;
  local_508 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_15.m_end = (iterator)pNVar10;
  msg_15.m_begin = pvVar7;
  file_15.m_end = (iterator)0x18e;
  file_15.m_begin = (iterator)&local_500;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_510,
             msg_15);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1c8,"noban@1.2.3.4:32",&local_529);
  rVar3.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)NetWhitebindPermissions::TryParse((string *)local_1c8,&noban,&error)
  ;
  local_528.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       rVar3.super_readonly_property<bool>.super_class_property<bool>.value;
  local_528.m_message.px = (element_type *)0x0;
  local_528.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_540 = "NetWhitebindPermissions::TryParse(\"noban@1.2.3.4:32\", noban, error)";
  local_538 = "";
  plVar17 = (lazy_ostream *)&strings;
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)((ulong)strings.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0113a070;
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst
  ;
  local_550 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_548 = "";
  pvVar7 = (iterator)0x2;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_528,plVar17,2,0,WARN,(check_type)pNVar9,(size_t)&local_550,0x18e);
  boost::detail::shared_count::~shared_count(&local_528.m_message.pn);
  std::__cxx11::string::~string((string *)local_1c8);
  local_560 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_558 = "";
  local_570 = &boost::unit_test::basic_cstring<char_const>::null;
  local_568 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_16.m_end = pvVar8;
  msg_16.m_begin = pvVar7;
  file_16.m_end = (iterator)0x18f;
  file_16.m_begin = (iterator)&local_560;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_570,
             msg_16);
  local_1c8[8] = false;
  local_1c8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = (long)"\x05\x04\x03\x02\x01" + 5;
  local_580 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_578 = "";
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(strings.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0x50);
  pvVar7 = (iterator)0x2;
  pNVar10 = &noban;
  pNVar9 = pNVar10;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,NetPermissionFlags,NetPermissionFlags>
            (local_1c8,&local_580,399,1,2,pNVar10,"noban.m_flags",plVar17,
             "NetPermissionFlags::NoBan");
  local_590 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_588 = "";
  local_5a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_598 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_17.m_end = (iterator)pNVar9;
  msg_17.m_begin = pvVar7;
  file_17.m_end = (iterator)0x190;
  file_17.m_begin = (iterator)&local_590;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_5a0,
             msg_17);
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)(CONCAT71(strings.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start._1_7_,
                          (byte)(undefined1)noban.super_NetPermissions.m_flags >> 6) &
                0xffffffffffffff01);
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_528._0_8_ = "NetPermissions::HasFlag(noban.m_flags, NetPermissionFlags::Download)";
  local_528.m_message.px = (element_type *)0xbb402a;
  local_1c8[8] = false;
  local_1c8._0_8_ = &PTR__lazy_ostream_0113a070;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_5b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_5a8 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  local_1b0 = &local_528;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&strings,(lazy_ostream *)local_1c8,1,0,WARN,(check_type)plVar17,
             (size_t)&local_5b0,400);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &strings.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_5c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_5b8 = "";
  local_5d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5c8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_18.m_end = pvVar8;
  msg_18.m_begin = pvVar7;
  file_18.m_end = (iterator)0x191;
  file_18.m_begin = (iterator)&local_5c0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_5d0,
             msg_18);
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(strings.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,
                         (~noban.super_NetPermissions.m_flags & 0x50) == 0);
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_528._0_8_ = "NetPermissions::HasFlag(noban.m_flags, NetPermissionFlags::NoBan)";
  local_528.m_message.px = (element_type *)0xbb406c;
  local_1c8[8] = false;
  local_1c8._0_8_ = &PTR__lazy_ostream_0113a070;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_5e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_5d8 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  local_1b0 = &local_528;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&strings,(lazy_ostream *)local_1c8,1,0,WARN,(check_type)plVar17,
             (size_t)&local_5e0,0x191);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &strings.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_5f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_5e8 = "";
  local_600 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5f8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_19.m_end = pvVar8;
  msg_19.m_begin = pvVar7;
  file_19.m_end = (iterator)0x194;
  file_19.m_begin = (iterator)&local_5f0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_600,
             msg_19);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1c8,"noban,download@1.2.3.4:32",&local_529);
  rVar4.super_class_property<bool>.value =
       (class_property<bool>)
       NetWhitebindPermissions::TryParse((string *)local_1c8,&noban_download,&error);
  local_528.m_message.px = (element_type *)0x0;
  local_528.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_540 = 
  "NetWhitebindPermissions::TryParse(\"noban,download@1.2.3.4:32\", noban_download, error)";
  local_538 = "";
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)((ulong)strings.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0113a070;
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst
  ;
  local_610 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_608 = "";
  pvVar7 = (iterator)0x2;
  pvVar8 = (iterator)0x0;
  local_528.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)rVar4.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            (&local_528,(lazy_ostream *)&strings,2,0,WARN,(check_type)plVar17,(size_t)&local_610,
             0x194);
  boost::detail::shared_count::~shared_count(&local_528.m_message.pn);
  std::__cxx11::string::~string((string *)local_1c8);
  local_620 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_618 = "";
  local_630 = &boost::unit_test::basic_cstring<char_const>::null;
  local_628 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_20.m_end = pvVar8;
  msg_20.m_begin = pvVar7;
  file_20.m_end = (iterator)0x195;
  file_20.m_begin = (iterator)&local_620;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_630,
             msg_20);
  local_1c8[8] = false;
  local_1c8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = (long)"\x05\x04\x03\x02\x01" + 5;
  local_640 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_638 = "";
  pvVar7 = (iterator)0x2;
  pNVar9 = &noban_download;
  pNVar15 = pNVar10;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,NetPermissionFlags,NetPermissionFlags>
            (local_1c8,&local_640,0x195,1,2,pNVar9,"noban_download.m_flags",pNVar10,"noban.m_flags")
  ;
  local_650 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_648 = "";
  local_660 = &boost::unit_test::basic_cstring<char_const>::null;
  local_658 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_21.m_end = (iterator)pNVar9;
  msg_21.m_begin = pvVar7;
  file_21.m_end = (iterator)0x198;
  file_21.m_begin = (iterator)&local_650;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_660,
             msg_21);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1c8,"download,noban@1.2.3.4:32",&local_529);
  local_528.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       NetWhitebindPermissions::TryParse((string *)local_1c8,&download_noban,&error);
  local_528.m_message.px = (element_type *)0x0;
  local_528.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_540 = 
  "NetWhitebindPermissions::TryParse(\"download,noban@1.2.3.4:32\", download_noban, error)";
  local_538 = "";
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)((ulong)strings.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0113a070;
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst
  ;
  local_670 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_668 = "";
  pvVar7 = (iterator)0x2;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_528,(lazy_ostream *)&strings,2,0,WARN,(check_type)pNVar15,(size_t)&local_670,
             0x198);
  boost::detail::shared_count::~shared_count(&local_528.m_message.pn);
  std::__cxx11::string::~string((string *)local_1c8);
  local_680 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_678 = "";
  local_690 = &boost::unit_test::basic_cstring<char_const>::null;
  local_688 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_22.m_end = pvVar8;
  msg_22.m_begin = pvVar7;
  file_22.m_end = (iterator)0x199;
  file_22.m_begin = (iterator)&local_680;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,(size_t)&local_690,
             msg_22);
  local_1c8[8] = false;
  local_1c8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = (long)"\x05\x04\x03\x02\x01" + 5;
  local_6a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_698 = "";
  pvVar7 = (iterator)0x2;
  pNVar9 = &download_noban;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,NetPermissionFlags,NetPermissionFlags>
            (local_1c8,&local_6a0,0x199,1,2,pNVar9,"download_noban.m_flags",pNVar10,"noban.m_flags")
  ;
  local_6b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_6a8 = "";
  local_6c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6b8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_23.m_end = (iterator)pNVar9;
  msg_23.m_begin = pvVar7;
  file_23.m_end = (iterator)0x19c;
  file_23.m_begin = (iterator)&local_6b0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_23,(size_t)&local_6c0,
             msg_23);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1c8,"download@1.2.3.4:32",&local_529);
  local_528.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       NetWhitebindPermissions::TryParse((string *)local_1c8,&download,&error);
  local_528.m_message.px = (element_type *)0x0;
  local_528.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_540 = "NetWhitebindPermissions::TryParse(\"download@1.2.3.4:32\", download, error)";
  local_538 = "";
  plVar17 = (lazy_ostream *)&strings;
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)((ulong)strings.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0113a070;
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst
  ;
  local_6d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_6c8 = "";
  pvVar7 = (iterator)0x2;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_528,plVar17,2,0,WARN,(check_type)pNVar10,(size_t)&local_6d0,0x19c);
  boost::detail::shared_count::~shared_count(&local_528.m_message.pn);
  std::__cxx11::string::~string((string *)local_1c8);
  local_6e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_6d8 = "";
  local_6f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6e8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_24.m_end = pvVar8;
  msg_24.m_begin = pvVar7;
  file_24.m_end = (iterator)0x19d;
  file_24.m_begin = (iterator)&local_6e0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_24,(size_t)&local_6f0,
             msg_24);
  local_1c8[8] = false;
  local_1c8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = (long)"\x05\x04\x03\x02\x01" + 5;
  local_700 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_6f8 = "";
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(strings.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0x40);
  pvVar7 = (iterator)0x2;
  pNVar10 = &download;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,NetPermissionFlags,NetPermissionFlags>
            (local_1c8,&local_700,0x19d,1,2,pNVar10,"download.m_flags",plVar17,
             "NetPermissionFlags::Download");
  local_710 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_708 = "";
  local_720 = &boost::unit_test::basic_cstring<char_const>::null;
  local_718 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_25.m_end = (iterator)pNVar10;
  msg_25.m_begin = pvVar7;
  file_25.m_end = (iterator)0x19e;
  file_25.m_begin = (iterator)&local_710;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_25,(size_t)&local_720,
             msg_25);
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)(CONCAT71(strings.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start._1_7_,
                          (byte)(undefined1)download.super_NetPermissions.m_flags >> 6) &
                0xffffffffffffff01);
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_528._0_8_ = "NetPermissions::HasFlag(download.m_flags, NetPermissionFlags::Download)";
  local_528.m_message.px = (element_type *)0xbb420c;
  local_1c8[8] = false;
  local_1c8._0_8_ = &PTR__lazy_ostream_0113a070;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_730 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_728 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  local_1b0 = &local_528;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&strings,(lazy_ostream *)local_1c8,1,0,WARN,(check_type)plVar17,
             (size_t)&local_730,0x19e);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &strings.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_740 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_738 = "";
  local_750 = &boost::unit_test::basic_cstring<char_const>::null;
  local_748 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_26.m_end = pvVar8;
  msg_26.m_begin = pvVar7;
  file_26.m_end = (iterator)0x19f;
  file_26.m_begin = (iterator)&local_740;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_26,(size_t)&local_750,
             msg_26);
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(strings.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,
                         (~download.super_NetPermissions.m_flags & 0x50) != 0);
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_528._0_8_ = "!NetPermissions::HasFlag(download.m_flags, NetPermissionFlags::NoBan)";
  local_528.m_message.px = (element_type *)0xbb4252;
  local_1c8[8] = false;
  local_1c8._0_8_ = &PTR__lazy_ostream_0113a070;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_760 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_758 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  local_1b0 = &local_528;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&strings,(lazy_ostream *)local_1c8,1,0,WARN,(check_type)plVar17,
             (size_t)&local_760,0x19f);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &strings.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_770 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_768 = "";
  local_780 = &boost::unit_test::basic_cstring<char_const>::null;
  local_778 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_27.m_end = pvVar8;
  msg_27.m_begin = pvVar7;
  file_27.m_end = (iterator)0x1a2;
  file_27.m_begin = (iterator)&local_770;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_27,(size_t)&local_780,
             msg_27);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1c8,"bloom,forcerelay@1.2.3.4:32",&local_529);
  rVar4.super_class_property<bool>.value =
       (class_property<bool>)
       NetWhitebindPermissions::TryParse((string *)local_1c8,&whitebindPermissions,&error);
  local_528.m_message.px = (element_type *)0x0;
  local_528.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_540 = 
  "NetWhitebindPermissions::TryParse(\"bloom,forcerelay@1.2.3.4:32\", whitebindPermissions, error)";
  local_538 = "";
  plVar16 = (lazy_ostream *)&strings;
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)((ulong)strings.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0113a070;
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst
  ;
  local_790 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_788 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  local_528.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)rVar4.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            (&local_528,plVar16,1,0,WARN,(check_type)plVar17,(size_t)&local_790,0x1a2);
  boost::detail::shared_count::~shared_count(&local_528.m_message.pn);
  std::__cxx11::string::~string((string *)local_1c8);
  local_7a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_798 = "";
  local_7b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7a8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_28.m_end = pvVar8;
  msg_28.m_begin = pvVar7;
  file_28.m_end = (iterator)0x1a4;
  file_28.m_begin = (iterator)&local_7a0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_28,(size_t)&local_7b0,
             msg_28);
  local_1c8[8] = false;
  local_1c8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = (long)"\x05\x04\x03\x02\x01" + 5;
  local_7c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_7b8 = "";
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(strings.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0xe);
  pvVar7 = (iterator)0x2;
  pNVar10 = &whitebindPermissions;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,NetPermissionFlags,NetPermissionFlags>
            (local_1c8,&local_7c0,0x1a4,1,2,pNVar10,"whitebindPermissions.m_flags",plVar16,
             "NetPermissionFlags::BloomFilter | NetPermissionFlags::ForceRelay | NetPermissionFlags::Relay"
            );
  local_7d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_7c8 = "";
  local_7e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7d8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_29.m_end = (iterator)pNVar10;
  msg_29.m_begin = pvVar7;
  file_29.m_end = (iterator)0x1a5;
  file_29.m_begin = (iterator)&local_7d0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_29,(size_t)&local_7e0,
             msg_29);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1c8,"bloom,relay,noban@1.2.3.4:32",&local_529);
  local_528.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       NetWhitebindPermissions::TryParse((string *)local_1c8,&whitebindPermissions,&error);
  local_528.m_message.px = (element_type *)0x0;
  local_528.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_540 = 
  "NetWhitebindPermissions::TryParse(\"bloom,relay,noban@1.2.3.4:32\", whitebindPermissions, error)"
  ;
  local_538 = "";
  plVar17 = (lazy_ostream *)&strings;
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)((ulong)strings.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0113a070;
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst
  ;
  local_7f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_7e8 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_528,plVar17,1,0,WARN,(check_type)plVar16,(size_t)&local_7f0,0x1a5);
  boost::detail::shared_count::~shared_count(&local_528.m_message.pn);
  std::__cxx11::string::~string((string *)local_1c8);
  local_800 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_7f8 = "";
  local_810 = &boost::unit_test::basic_cstring<char_const>::null;
  local_808 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_30.m_end = pvVar8;
  msg_30.m_begin = pvVar7;
  file_30.m_end = (iterator)0x1a6;
  file_30.m_begin = (iterator)&local_800;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_30,(size_t)&local_810,
             msg_30);
  local_1c8[8] = false;
  local_1c8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = (long)"\x05\x04\x03\x02\x01" + 5;
  local_820 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_818 = "";
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(strings.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0x5a);
  pvVar7 = (iterator)0x2;
  pNVar10 = &whitebindPermissions;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,NetPermissionFlags,NetPermissionFlags>
            (local_1c8,&local_820,0x1a6,1,2,pNVar10,"whitebindPermissions.m_flags",plVar17,
             "NetPermissionFlags::BloomFilter | NetPermissionFlags::Relay | NetPermissionFlags::NoBan"
            );
  local_830 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_828 = "";
  local_840 = &boost::unit_test::basic_cstring<char_const>::null;
  local_838 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_31.m_end = (iterator)pNVar10;
  msg_31.m_begin = pvVar7;
  file_31.m_end = (iterator)0x1a7;
  file_31.m_begin = (iterator)&local_830;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_31,(size_t)&local_840,
             msg_31);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1c8,"bloom,forcerelay,noban@1.2.3.4:32",&local_529);
  local_528.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       NetWhitebindPermissions::TryParse((string *)local_1c8,&whitebindPermissions,&error);
  local_528.m_message.px = (element_type *)0x0;
  local_528.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_540 = 
  "NetWhitebindPermissions::TryParse(\"bloom,forcerelay,noban@1.2.3.4:32\", whitebindPermissions, error)"
  ;
  local_538 = "";
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)((ulong)strings.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0113a070;
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst
  ;
  local_850 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_848 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_528,(lazy_ostream *)&strings,1,0,WARN,(check_type)plVar17,(size_t)&local_850,
             0x1a7);
  boost::detail::shared_count::~shared_count(&local_528.m_message.pn);
  std::__cxx11::string::~string((string *)local_1c8);
  local_860 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_858 = "";
  local_870 = &boost::unit_test::basic_cstring<char_const>::null;
  local_868 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_32.m_end = pvVar8;
  msg_32.m_begin = pvVar7;
  file_32.m_end = (iterator)0x1a8;
  file_32.m_begin = (iterator)&local_860;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_32,(size_t)&local_870,
             msg_32);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1c8,"all@1.2.3.4:32",&local_529);
  local_528.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       NetWhitebindPermissions::TryParse((string *)local_1c8,&whitebindPermissions,&error);
  local_528.m_message.px = (element_type *)0x0;
  local_528.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_540 = "NetWhitebindPermissions::TryParse(\"all@1.2.3.4:32\", whitebindPermissions, error)";
  local_538 = "";
  plVar16 = (lazy_ostream *)&strings;
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)((ulong)strings.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0113a070;
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst
  ;
  local_880 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_878 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_528,plVar16,1,0,WARN,(check_type)plVar17,(size_t)&local_880,0x1a8);
  boost::detail::shared_count::~shared_count(&local_528.m_message.pn);
  std::__cxx11::string::~string((string *)local_1c8);
  local_890 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_888 = "";
  local_8a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_898 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_33.m_end = pvVar8;
  msg_33.m_begin = pvVar7;
  file_33.m_end = (iterator)0x1a9;
  file_33.m_begin = (iterator)&local_890;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_33,(size_t)&local_8a0,
             msg_33);
  local_1c8[8] = false;
  local_1c8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = (long)"\x05\x04\x03\x02\x01" + 5;
  local_8b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_8a8 = "";
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(strings.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0xfe);
  pvVar7 = (iterator)0x2;
  pNVar10 = &whitebindPermissions;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,NetPermissionFlags,NetPermissionFlags>
            (local_1c8,&local_8b0,0x1a9,1,2,pNVar10,"whitebindPermissions.m_flags",plVar16,
             "NetPermissionFlags::All");
  local_8c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_8b8 = "";
  local_8d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8c8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_34.m_end = (iterator)pNVar10;
  msg_34.m_begin = pvVar7;
  file_34.m_end = (iterator)0x1ac;
  file_34.m_begin = (iterator)&local_8c0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_34,(size_t)&local_8d0,
             msg_34);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1c8,"bloom,relay,noban,noban@1.2.3.4:32",&local_529);
  local_528.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       NetWhitebindPermissions::TryParse((string *)local_1c8,&whitebindPermissions,&error);
  local_528.m_message.px = (element_type *)0x0;
  local_528.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_540 = 
  "NetWhitebindPermissions::TryParse(\"bloom,relay,noban,noban@1.2.3.4:32\", whitebindPermissions, error)"
  ;
  local_538 = "";
  plVar17 = (lazy_ostream *)&strings;
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)((ulong)strings.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0113a070;
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst
  ;
  local_8e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_8d8 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_528,plVar17,1,0,WARN,(check_type)plVar16,(size_t)&local_8e0,0x1ac);
  boost::detail::shared_count::~shared_count(&local_528.m_message.pn);
  std::__cxx11::string::~string((string *)local_1c8);
  local_8f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_8e8 = "";
  local_900 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8f8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_35.m_end = pvVar8;
  msg_35.m_begin = pvVar7;
  file_35.m_end = (iterator)0x1ad;
  file_35.m_begin = (iterator)&local_8f0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_35,(size_t)&local_900,
             msg_35);
  local_1c8[8] = false;
  local_1c8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = (long)"\x05\x04\x03\x02\x01" + 5;
  local_910 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_908 = "";
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(strings.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0x5a);
  pvVar7 = (iterator)0x2;
  pNVar10 = &whitebindPermissions;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,NetPermissionFlags,NetPermissionFlags>
            (local_1c8,&local_910,0x1ad,1,2,pNVar10,"whitebindPermissions.m_flags",plVar17,
             "NetPermissionFlags::BloomFilter | NetPermissionFlags::Relay | NetPermissionFlags::NoBan | NetPermissionFlags::Download"
            );
  local_920 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_918 = "";
  local_930 = &boost::unit_test::basic_cstring<char_const>::null;
  local_928 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_36.m_end = (iterator)pNVar10;
  msg_36.m_begin = pvVar7;
  file_36.m_end = (iterator)0x1b0;
  file_36.m_begin = (iterator)&local_920;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_36,(size_t)&local_930,
             msg_36);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1c8,"bloom,relay,,noban@1.2.3.4:32",&local_529);
  local_528.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       NetWhitebindPermissions::TryParse((string *)local_1c8,&whitebindPermissions,&error);
  local_528.m_message.px = (element_type *)0x0;
  local_528.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_540 = 
  "NetWhitebindPermissions::TryParse(\"bloom,relay,,noban@1.2.3.4:32\", whitebindPermissions, error)"
  ;
  local_538 = "";
  plVar16 = (lazy_ostream *)&strings;
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)((ulong)strings.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0113a070;
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst
  ;
  local_940 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_938 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_528,plVar16,1,0,WARN,(check_type)plVar17,(size_t)&local_940,0x1b0);
  boost::detail::shared_count::~shared_count(&local_528.m_message.pn);
  std::__cxx11::string::~string((string *)local_1c8);
  local_950 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_948 = "";
  local_960 = &boost::unit_test::basic_cstring<char_const>::null;
  local_958 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_37.m_end = pvVar8;
  msg_37.m_begin = pvVar7;
  file_37.m_end = (iterator)0x1b1;
  file_37.m_begin = (iterator)&local_950;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_37,(size_t)&local_960,
             msg_37);
  local_1c8[8] = false;
  local_1c8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = (long)"\x05\x04\x03\x02\x01" + 5;
  local_970 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_968 = "";
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(strings.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0x5a);
  pvVar7 = (iterator)0x2;
  pNVar10 = &whitebindPermissions;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,NetPermissionFlags,NetPermissionFlags>
            (local_1c8,&local_970,0x1b1,1,2,pNVar10,"whitebindPermissions.m_flags",plVar16,
             "NetPermissionFlags::BloomFilter | NetPermissionFlags::Relay | NetPermissionFlags::NoBan"
            );
  local_980 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_978 = "";
  local_990 = &boost::unit_test::basic_cstring<char_const>::null;
  local_988 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_38.m_end = (iterator)pNVar10;
  msg_38.m_begin = pvVar7;
  file_38.m_end = (iterator)0x1b2;
  file_38.m_begin = (iterator)&local_980;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_38,(size_t)&local_990,
             msg_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_1c8,",@1.2.3.4:32",&local_529);
  local_528.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       NetWhitebindPermissions::TryParse((string *)local_1c8,&whitebindPermissions,&error);
  local_528.m_message.px = (element_type *)0x0;
  local_528.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_540 = "NetWhitebindPermissions::TryParse(\",@1.2.3.4:32\", whitebindPermissions, error)";
  local_538 = "";
  plVar17 = (lazy_ostream *)&strings;
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)((ulong)strings.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0113a070;
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst
  ;
  local_9a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_998 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_528,plVar17,1,0,WARN,(check_type)plVar16,(size_t)&local_9a0,0x1b2);
  boost::detail::shared_count::~shared_count(&local_528.m_message.pn);
  std::__cxx11::string::~string((string *)local_1c8);
  local_9b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_9a8 = "";
  local_9c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_9b8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_39.m_end = pvVar8;
  msg_39.m_begin = pvVar7;
  file_39.m_end = (iterator)0x1b3;
  file_39.m_begin = (iterator)&local_9b0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_39,(size_t)&local_9c0,
             msg_39);
  local_1c8[8] = false;
  local_1c8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = (long)"\x05\x04\x03\x02\x01" + 5;
  local_9d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_9c8 = "";
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((ulong)strings.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
  pvVar7 = (iterator)0x2;
  pNVar10 = &whitebindPermissions;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,NetPermissionFlags,NetPermissionFlags>
            (local_1c8,&local_9d0,0x1b3,1,2,pNVar10,"whitebindPermissions.m_flags",plVar17,
             "NetPermissionFlags::None");
  local_9e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_9d8 = "";
  local_9f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_9e8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_40.m_end = (iterator)pNVar10;
  msg_40.m_begin = pvVar7;
  file_40.m_end = (iterator)0x1b4;
  file_40.m_begin = (iterator)&local_9e0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_40,(size_t)&local_9f0,
             msg_40);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_1c8,",,@1.2.3.4:32",&local_529)
  ;
  local_528.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       NetWhitebindPermissions::TryParse((string *)local_1c8,&whitebindPermissions,&error);
  local_528.m_message.px = (element_type *)0x0;
  local_528.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_540 = "NetWhitebindPermissions::TryParse(\",,@1.2.3.4:32\", whitebindPermissions, error)";
  local_538 = "";
  plVar16 = (lazy_ostream *)&strings;
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)((ulong)strings.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0113a070;
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst
  ;
  local_a00 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_9f8 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_528,plVar16,1,0,WARN,(check_type)plVar17,(size_t)&local_a00,0x1b4);
  boost::detail::shared_count::~shared_count(&local_528.m_message.pn);
  std::__cxx11::string::~string((string *)local_1c8);
  local_a10 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_a08 = "";
  local_a20 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a18 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_41.m_end = pvVar8;
  msg_41.m_begin = pvVar7;
  file_41.m_end = (iterator)0x1b5;
  file_41.m_begin = (iterator)&local_a10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_41,(size_t)&local_a20,
             msg_41);
  local_1c8[8] = false;
  local_1c8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = (long)"\x05\x04\x03\x02\x01" + 5;
  local_a30 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_a28 = "";
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((ulong)strings.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
  pvVar7 = (iterator)0x2;
  pNVar10 = &whitebindPermissions;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,NetPermissionFlags,NetPermissionFlags>
            (local_1c8,&local_a30,0x1b5,1,2,pNVar10,"whitebindPermissions.m_flags",plVar16,
             "NetPermissionFlags::None");
  local_a40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_a38 = "";
  local_a50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a48 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_42.m_end = (iterator)pNVar10;
  msg_42.m_begin = pvVar7;
  file_42.m_end = (iterator)0x1b7;
  file_42.m_begin = (iterator)&local_a40;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_42,(size_t)&local_a50,
             msg_42);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1c8,"out,forcerelay@1.2.3.4:32",&local_529);
  bVar2 = NetWhitebindPermissions::TryParse((string *)local_1c8,&whitebindPermissions,&error);
  local_528.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar2;
  local_528.m_message.px = (element_type *)0x0;
  local_528.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_540 = 
  "!NetWhitebindPermissions::TryParse(\"out,forcerelay@1.2.3.4:32\", whitebindPermissions, error)";
  local_538 = "";
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)((ulong)strings.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0113a070;
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst
  ;
  local_a60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_a58 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_528,(lazy_ostream *)&strings,1,0,WARN,(check_type)plVar16,(size_t)&local_a60,
             0x1b7);
  boost::detail::shared_count::~shared_count(&local_528.m_message.pn);
  std::__cxx11::string::~string((string *)local_1c8);
  local_a70 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_a68 = "";
  local_a80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a78 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_43.m_end = pvVar8;
  msg_43.m_begin = pvVar7;
  file_43.m_end = (iterator)0x1b8;
  file_43.m_begin = (iterator)&local_a70;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_43,(size_t)&local_a80,
             msg_43);
  sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    (&error.original,
                     "whitebind may only be used for incoming connections (\"out\" was passed)",0);
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(strings.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,sVar5 != 0xffffffffffffffff
                        );
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_528._0_8_ =
       "error.original.find(\"whitebind may only be used for incoming connections (\\\"out\\\" was passed)\") != std::string::npos"
  ;
  local_528.m_message.px = (element_type *)0xbb4858;
  local_1c8[8] = false;
  local_1c8._0_8_ = &PTR__lazy_ostream_0113a070;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_a90 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_a88 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  local_1b0 = &local_528;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&strings,(lazy_ostream *)local_1c8,1,0,WARN,(check_type)plVar16,
             (size_t)&local_a90,0x1b8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &strings.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_aa0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_a98 = "";
  local_ab0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_aa8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_44.m_end = pvVar8;
  msg_44.m_begin = pvVar7;
  file_44.m_end = (iterator)0x1bb;
  file_44.m_begin = (iterator)&local_aa0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_44,(size_t)&local_ab0,
             msg_44);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1c8,"bloom,forcerelay,oopsie@1.2.3.4:32",&local_529);
  bVar2 = NetWhitebindPermissions::TryParse((string *)local_1c8,&whitebindPermissions,&error);
  local_528.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar2;
  local_528.m_message.px = (element_type *)0x0;
  local_528.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_540 = 
  "!NetWhitebindPermissions::TryParse(\"bloom,forcerelay,oopsie@1.2.3.4:32\", whitebindPermissions, error)"
  ;
  local_538 = "";
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)((ulong)strings.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0113a070;
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst
  ;
  local_ac0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_ab8 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_528,(lazy_ostream *)&strings,1,0,WARN,(check_type)plVar16,(size_t)&local_ac0,
             0x1bb);
  boost::detail::shared_count::~shared_count(&local_528.m_message.pn);
  std::__cxx11::string::~string((string *)local_1c8);
  local_ad0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_ac8 = "";
  local_ae0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_ad8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_45.m_end = pvVar8;
  msg_45.m_begin = pvVar7;
  file_45.m_end = (iterator)0x1bc;
  file_45.m_begin = (iterator)&local_ad0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_45,(size_t)&local_ae0,
             msg_45);
  sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    (&error.original,"Invalid P2P permission",0);
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(strings.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,sVar5 != 0xffffffffffffffff
                        );
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_528._0_8_ = "error.original.find(\"Invalid P2P permission\") != std::string::npos";
  local_528.m_message.px = (element_type *)0xbb493b;
  local_1c8[8] = false;
  local_1c8._0_8_ = &PTR__lazy_ostream_0113a070;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_af0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_ae8 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  local_1b0 = &local_528;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&strings,(lazy_ostream *)local_1c8,1,0,WARN,(check_type)plVar16,
             (size_t)&local_af0,0x1bc);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &strings.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_b00 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_af8 = "";
  local_b10 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b08 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_46.m_end = pvVar8;
  msg_46.m_begin = pvVar7;
  file_46.m_end = (iterator)0x1bf;
  file_46.m_begin = (iterator)&local_b00;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_46,(size_t)&local_b10,
             msg_46);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1c8,"bloom,forcerelay,noban@1.2.3.4:32",&local_529);
  bVar2 = NetWhitelistPermissions::TryParse
                    ((string *)local_1c8,&whitelistPermissions,&connection_direction,&error);
  local_528.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar2;
  local_528.m_message.px = (element_type *)0x0;
  local_528.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_540 = 
  "!NetWhitelistPermissions::TryParse(\"bloom,forcerelay,noban@1.2.3.4:32\", whitelistPermissions, connection_direction, error)"
  ;
  local_538 = "";
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)((ulong)strings.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0113a070;
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst
  ;
  local_b20 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_b18 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_528,(lazy_ostream *)&strings,1,0,WARN,(check_type)plVar16,(size_t)&local_b20,
             0x1bf);
  boost::detail::shared_count::~shared_count(&local_528.m_message.pn);
  std::__cxx11::string::~string((string *)local_1c8);
  local_b30 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_b28 = "";
  local_b40 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b38 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_47.m_end = pvVar8;
  msg_47.m_begin = pvVar7;
  file_47.m_end = (iterator)0x1c0;
  file_47.m_begin = (iterator)&local_b30;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_47,(size_t)&local_b40,
             msg_47);
  sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    (&error.original,"Invalid netmask specified in -whitelist",0);
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(strings.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,sVar5 != 0xffffffffffffffff
                        );
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_528._0_8_ =
       "error.original.find(\"Invalid netmask specified in -whitelist\") != std::string::npos";
  local_528.m_message.px = (element_type *)0xbb4a32;
  local_1c8[8] = false;
  local_1c8._0_8_ = &PTR__lazy_ostream_0113a070;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_b50 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_b48 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  local_1b0 = &local_528;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&strings,(lazy_ostream *)local_1c8,1,0,WARN,(check_type)plVar16,
             (size_t)&local_b50,0x1c0);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &strings.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_b60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_b58 = "";
  local_b70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b68 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_48.m_end = pvVar8;
  msg_48.m_begin = pvVar7;
  file_48.m_end = (iterator)0x1c3;
  file_48.m_begin = (iterator)&local_b60;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_48,(size_t)&local_b70,
             msg_48);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_1c8,"noban@1.2.3.4",&local_529)
  ;
  rVar3.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       NetWhitelistPermissions::TryParse
                 ((string *)local_1c8,&whitelistPermissions,&connection_direction,&error);
  local_528.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       rVar3.super_readonly_property<bool>.super_class_property<bool>.value;
  local_528.m_message.px = (element_type *)0x0;
  local_528.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_540 = 
  "NetWhitelistPermissions::TryParse(\"noban@1.2.3.4\", whitelistPermissions, connection_direction, error)"
  ;
  local_538 = "";
  plVar17 = (lazy_ostream *)&strings;
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)((ulong)strings.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0113a070;
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst
  ;
  local_b80 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_b78 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_528,plVar17,1,0,WARN,(check_type)plVar16,(size_t)&local_b80,0x1c3);
  boost::detail::shared_count::~shared_count(&local_528.m_message.pn);
  std::__cxx11::string::~string((string *)local_1c8);
  local_b90 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_b88 = "";
  local_ba0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b98 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_49.m_end = pvVar8;
  msg_49.m_begin = pvVar7;
  file_49.m_end = (iterator)0x1c4;
  file_49.m_begin = (iterator)&local_b90;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_49,(size_t)&local_ba0,
             msg_49);
  local_1c8[8] = false;
  local_1c8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = (long)"\x05\x04\x03\x02\x01" + 5;
  local_bb0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_ba8 = "";
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(strings.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0x50);
  pvVar7 = (iterator)0x2;
  pNVar11 = &whitelistPermissions;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,NetPermissionFlags,NetPermissionFlags>
            (local_1c8,&local_bb0,0x1c4,1,2,pNVar11,"whitelistPermissions.m_flags",plVar17,
             "NetPermissionFlags::NoBan");
  local_bc0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_bb8 = "";
  local_bd0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_bc8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_50.m_end = (iterator)pNVar11;
  msg_50.m_begin = pvVar7;
  file_50.m_end = (iterator)0x1c5;
  file_50.m_begin = (iterator)&local_bc0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_50,(size_t)&local_bd0,
             msg_50);
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(strings.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,
                         (~whitelistPermissions.super_NetPermissions.m_flags & 0x50) == 0);
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_528._0_8_ =
       "NetPermissions::HasFlag(whitelistPermissions.m_flags, NetPermissionFlags::NoBan)";
  local_528.m_message.px = (element_type *)0xbb4b14;
  local_1c8[8] = false;
  local_1c8._0_8_ = &PTR__lazy_ostream_0113a070;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_be0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_bd8 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  local_1b0 = &local_528;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&strings,(lazy_ostream *)local_1c8,1,0,WARN,(check_type)plVar17,
             (size_t)&local_be0,0x1c5);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &strings.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_bf0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_be8 = "";
  local_c00 = &boost::unit_test::basic_cstring<char_const>::null;
  local_bf8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_51.m_end = pvVar8;
  msg_51.m_begin = pvVar7;
  file_51.m_end = (iterator)0x1c7;
  file_51.m_begin = (iterator)&local_bf0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_51,(size_t)&local_c00,
             msg_51);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1c8,"bloom,forcerelay,noban,relay@1.2.3.4/32",&local_529);
  rVar3.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       NetWhitelistPermissions::TryParse
                 ((string *)local_1c8,&whitelistPermissions,&connection_direction,&error);
  local_528.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       rVar3.super_readonly_property<bool>.super_class_property<bool>.value;
  local_528.m_message.px = (element_type *)0x0;
  local_528.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_540 = 
  "NetWhitelistPermissions::TryParse(\"bloom,forcerelay,noban,relay@1.2.3.4/32\", whitelistPermissions, connection_direction, error)"
  ;
  local_538 = "";
  plVar16 = (lazy_ostream *)&strings;
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)((ulong)strings.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0113a070;
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst
  ;
  local_c10 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_c08 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_528,plVar16,1,0,WARN,(check_type)plVar17,(size_t)&local_c10,0x1c7);
  boost::detail::shared_count::~shared_count(&local_528.m_message.pn);
  std::__cxx11::string::~string((string *)local_1c8);
  local_c20 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_c18 = "";
  local_c30 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c28 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_52.m_end = pvVar8;
  msg_52.m_begin = pvVar7;
  file_52.m_end = (iterator)0x1c8;
  file_52.m_begin = (iterator)&local_c20;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_52,(size_t)&local_c30,
             msg_52);
  local_1c8[8] = false;
  local_1c8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = (long)"\x05\x04\x03\x02\x01" + 5;
  local_c40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_c38 = "";
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(strings.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0x5e);
  pvVar7 = (iterator)0x2;
  pNVar11 = &whitelistPermissions;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,NetPermissionFlags,NetPermissionFlags>
            (local_1c8,&local_c40,0x1c8,1,2,pNVar11,"whitelistPermissions.m_flags",plVar16,
             "NetPermissionFlags::BloomFilter | NetPermissionFlags::ForceRelay | NetPermissionFlags::NoBan | NetPermissionFlags::Relay"
            );
  local_c50 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_c48 = "";
  local_c60 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c58 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_53.m_end = (iterator)pNVar11;
  msg_53.m_begin = pvVar7;
  file_53.m_end = (iterator)0x1c9;
  file_53.m_begin = (iterator)&local_c50;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_53,(size_t)&local_c60,
             msg_53);
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(strings.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,
                         error.original._M_string_length == 0);
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_528._0_8_ = "error.empty()";
  local_528.m_message.px = (element_type *)0xe00adf;
  local_1c8[8] = false;
  local_1c8._0_8_ = &PTR__lazy_ostream_0113a070;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_c70 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_c68 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  local_1b0 = &local_528;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&strings,(lazy_ostream *)local_1c8,1,0,WARN,(check_type)plVar16,
             (size_t)&local_c70,0x1c9);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &strings.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_c80 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_c78 = "";
  local_c90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c88 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_54.m_end = pvVar8;
  msg_54.m_begin = pvVar7;
  file_54.m_end = (iterator)0x1ca;
  file_54.m_begin = (iterator)&local_c80;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_54,(size_t)&local_c90,
             msg_54);
  local_1c8[8] = false;
  local_1c8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = (long)"\x05\x04\x03\x02\x01" + 5;
  local_ca0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_c98 = "";
  CSubNet::ToString_abi_cxx11_((string *)&strings,&whitelistPermissions.m_subnet);
  pcVar18 = "1.2.3.4/32";
  pvVar7 = (iterator)0x2;
  pvVar12 = &strings;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[11]>
            (local_1c8,&local_ca0,0x1ca,1,2,pvVar12,"whitelistPermissions.m_subnet.ToString()",
             "1.2.3.4/32","\"1.2.3.4/32\"");
  std::__cxx11::string::~string((string *)&strings);
  local_cb0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_ca8 = "";
  local_cc0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_cb8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_55.m_end = (iterator)pvVar12;
  msg_55.m_begin = pvVar7;
  file_55.m_end = (iterator)0x1cb;
  file_55.m_begin = (iterator)&local_cb0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_55,(size_t)&local_cc0,
             msg_55);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1c8,"bloom,forcerelay,noban,relay,mempool@1.2.3.4/32",&local_529);
  rVar4.super_class_property<bool>.value =
       (class_property<bool>)
       NetWhitelistPermissions::TryParse
                 ((string *)local_1c8,&whitelistPermissions,&connection_direction,&error);
  local_528.m_message.px = (element_type *)0x0;
  local_528.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_540 = 
  "NetWhitelistPermissions::TryParse(\"bloom,forcerelay,noban,relay,mempool@1.2.3.4/32\", whitelistPermissions, connection_direction, error)"
  ;
  local_538 = "";
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)((ulong)strings.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0113a070;
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst
  ;
  local_cd0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_cc8 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  local_528.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)rVar4.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            (&local_528,(lazy_ostream *)&strings,1,0,WARN,(check_type)pcVar18,(size_t)&local_cd0,
             0x1cb);
  boost::detail::shared_count::~shared_count(&local_528.m_message.pn);
  std::__cxx11::string::~string((string *)local_1c8);
  local_ce0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_cd8 = "";
  local_cf0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_ce8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_56.m_end = pvVar8;
  msg_56.m_begin = pvVar7;
  file_56.m_end = (iterator)0x1cc;
  file_56.m_begin = (iterator)&local_ce0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_56,(size_t)&local_cf0,
             msg_56);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1c8,"in,relay@1.2.3.4",&local_529);
  local_528.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       NetWhitelistPermissions::TryParse
                 ((string *)local_1c8,&whitelistPermissions,&connection_direction,&error);
  local_528.m_message.px = (element_type *)0x0;
  local_528.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_540 = 
  "NetWhitelistPermissions::TryParse(\"in,relay@1.2.3.4\", whitelistPermissions, connection_direction, error)"
  ;
  local_538 = "";
  plVar17 = (lazy_ostream *)&strings;
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)((ulong)strings.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0113a070;
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst
  ;
  local_d00 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_cf8 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_528,plVar17,1,0,WARN,(check_type)pcVar18,(size_t)&local_d00,0x1cc);
  boost::detail::shared_count::~shared_count(&local_528.m_message.pn);
  std::__cxx11::string::~string((string *)local_1c8);
  local_d10 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_d08 = "";
  local_d20 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d18 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_57.m_end = pvVar8;
  msg_57.m_begin = pvVar7;
  file_57.m_end = (iterator)0x1cd;
  file_57.m_begin = (iterator)&local_d10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_57,(size_t)&local_d20,
             msg_57);
  local_1c8[8] = false;
  local_1c8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = (long)"\x05\x04\x03\x02\x01" + 5;
  local_d30 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_d28 = "";
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(strings.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,1);
  pvVar7 = (iterator)0x2;
  pCVar13 = &connection_direction;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,ConnectionDirection,ConnectionDirection>
            (local_1c8,&local_d30,0x1cd,1,2,pCVar13,"connection_direction",plVar17,
             "ConnectionDirection::In");
  local_d40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_d38 = "";
  local_d50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d48 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_58.m_end = (iterator)pCVar13;
  msg_58.m_begin = pvVar7;
  file_58.m_end = (iterator)0x1ce;
  file_58.m_begin = (iterator)&local_d40;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_58,(size_t)&local_d50,
             msg_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1c8,"out,bloom@1.2.3.4",&local_529);
  local_528.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       NetWhitelistPermissions::TryParse
                 ((string *)local_1c8,&whitelistPermissions,&connection_direction,&error);
  local_528.m_message.px = (element_type *)0x0;
  local_528.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_540 = 
  "NetWhitelistPermissions::TryParse(\"out,bloom@1.2.3.4\", whitelistPermissions, connection_direction, error)"
  ;
  local_538 = "";
  plVar16 = (lazy_ostream *)&strings;
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)((ulong)strings.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0113a070;
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst
  ;
  local_d60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_d58 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_528,plVar16,1,0,WARN,(check_type)plVar17,(size_t)&local_d60,0x1ce);
  boost::detail::shared_count::~shared_count(&local_528.m_message.pn);
  std::__cxx11::string::~string((string *)local_1c8);
  local_d70 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_d68 = "";
  local_d80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d78 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_59.m_end = pvVar8;
  msg_59.m_begin = pvVar7;
  file_59.m_end = (iterator)0x1cf;
  file_59.m_begin = (iterator)&local_d70;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_59,(size_t)&local_d80,
             msg_59);
  local_1c8[8] = false;
  local_1c8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = (long)"\x05\x04\x03\x02\x01" + 5;
  local_d90 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_d88 = "";
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(strings.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,2);
  pvVar7 = (iterator)0x2;
  pCVar13 = &connection_direction;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,ConnectionDirection,ConnectionDirection>
            (local_1c8,&local_d90,0x1cf,1,2,pCVar13,"connection_direction",plVar16,
             "ConnectionDirection::Out");
  local_da0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_d98 = "";
  local_db0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_da8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_60.m_end = (iterator)pCVar13;
  msg_60.m_begin = pvVar7;
  file_60.m_end = (iterator)0x1d0;
  file_60.m_begin = (iterator)&local_da0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_60,(size_t)&local_db0,
             msg_60);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1c8,"in,out,bloom@1.2.3.4",&local_529);
  local_528.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       NetWhitelistPermissions::TryParse
                 ((string *)local_1c8,&whitelistPermissions,&connection_direction,&error);
  local_528.m_message.px = (element_type *)0x0;
  local_528.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_540 = 
  "NetWhitelistPermissions::TryParse(\"in,out,bloom@1.2.3.4\", whitelistPermissions, connection_direction, error)"
  ;
  local_538 = "";
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)((ulong)strings.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0113a070;
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst
  ;
  local_dc0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_db8 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_528,(lazy_ostream *)&strings,1,0,WARN,(check_type)plVar16,(size_t)&local_dc0,
             0x1d0);
  boost::detail::shared_count::~shared_count(&local_528.m_message.pn);
  std::__cxx11::string::~string((string *)local_1c8);
  local_dd0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_dc8 = "";
  local_de0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_dd8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_61.m_end = pvVar8;
  msg_61.m_begin = pvVar7;
  file_61.m_end = (iterator)0x1d1;
  file_61.m_begin = (iterator)&local_dd0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_61,(size_t)&local_de0,
             msg_61);
  local_1c8[8] = false;
  local_1c8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = (long)"\x05\x04\x03\x02\x01" + 5;
  local_df0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_de8 = "";
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(strings.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,3);
  pvVar7 = (iterator)0x2;
  pCVar13 = &connection_direction;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,ConnectionDirection,ConnectionDirection>
            (local_1c8,&local_df0,0x1d1,1,2,pCVar13,"connection_direction",(lazy_ostream *)&strings,
             "ConnectionDirection::Both");
  NetPermissions::ToStrings_abi_cxx11_(&strings,(NetPermissions *)0xfe,flags);
  local_e00 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_df8 = "";
  local_e10 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e08 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_62.m_end = (iterator)pCVar13;
  msg_62.m_begin = pvVar7;
  file_62.m_end = (iterator)0x1d4;
  file_62.m_begin = (iterator)&local_e00;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_62,(size_t)&local_e10,
             msg_62);
  local_1c8[8] = false;
  local_1c8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = (long)"\x05\x04\x03\x02\x01" + 5;
  local_e20 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_e18 = "";
  local_528._0_8_ =
       (long)strings.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)strings.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start >> 5;
  ppcVar14 = (char **)&local_528;
  local_540 = (char *)CONCAT44(local_540._4_4_,7);
  ppcVar19 = &local_540;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (local_1c8,&local_e20,0x1d4,1,2,ppcVar14,"strings.size()",ppcVar19,"7U");
  local_e30 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_e28 = "";
  local_e40 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e38 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_63.m_end = (iterator)ppcVar14;
  msg_63.m_begin = pvVar7;
  file_63.m_end = (iterator)0x1d5;
  file_63.m_begin = (iterator)&local_e30;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_63,(size_t)&local_e40,
             msg_63);
  _Var6 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[12]>>
                    (strings.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     strings.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,"bloomfilter");
  local_528.m_message.px = (element_type *)0x0;
  local_528.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_540 = "std::find(strings.begin(), strings.end(), \"bloomfilter\") != strings.end()";
  local_538 = "";
  local_1c8[8] = false;
  local_1c8._0_8_ = &PTR__lazy_ostream_0113a070;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = &local_540;
  local_e50 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_e48 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  local_528.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)
       (_Var6._M_current !=
       strings.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish);
  boost::test_tools::tt_detail::report_assertion
            (&local_528,(lazy_ostream *)local_1c8,1,0,WARN,(check_type)ppcVar19,(size_t)&local_e50,
             0x1d5);
  boost::detail::shared_count::~shared_count(&local_528.m_message.pn);
  local_e60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_e58 = "";
  local_e70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e68 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_64.m_end = pvVar8;
  msg_64.m_begin = pvVar7;
  file_64.m_end = (iterator)0x1d6;
  file_64.m_begin = (iterator)&local_e60;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_64,(size_t)&local_e70,
             msg_64);
  _Var6 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[11]>>
                    (strings.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     strings.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,"forcerelay");
  local_528.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (_Var6._M_current !=
       strings.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish);
  local_528.m_message.px = (element_type *)0x0;
  local_528.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_540 = "std::find(strings.begin(), strings.end(), \"forcerelay\") != strings.end()";
  local_538 = "";
  local_1c8[8] = false;
  local_1c8._0_8_ = &PTR__lazy_ostream_0113a070;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = &local_540;
  local_e80 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_e78 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_528,(lazy_ostream *)local_1c8,1,0,WARN,(check_type)ppcVar19,(size_t)&local_e80,
             0x1d6);
  boost::detail::shared_count::~shared_count(&local_528.m_message.pn);
  local_e90 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_e88 = "";
  local_ea0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e98 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_65.m_end = pvVar8;
  msg_65.m_begin = pvVar7;
  file_65.m_end = (iterator)0x1d7;
  file_65.m_begin = (iterator)&local_e90;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_65,(size_t)&local_ea0,
             msg_65);
  _Var6 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[6]>>
                    (strings.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     strings.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,"relay");
  local_528.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (_Var6._M_current !=
       strings.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish);
  local_528.m_message.px = (element_type *)0x0;
  local_528.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_540 = "std::find(strings.begin(), strings.end(), \"relay\") != strings.end()";
  local_538 = "";
  local_1c8[8] = false;
  local_1c8._0_8_ = &PTR__lazy_ostream_0113a070;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = &local_540;
  local_eb0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_ea8 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_528,(lazy_ostream *)local_1c8,1,0,WARN,(check_type)ppcVar19,(size_t)&local_eb0,
             0x1d7);
  boost::detail::shared_count::~shared_count(&local_528.m_message.pn);
  local_ec0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_eb8 = "";
  local_ed0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_ec8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_66.m_end = pvVar8;
  msg_66.m_begin = pvVar7;
  file_66.m_end = (iterator)0x1d8;
  file_66.m_begin = (iterator)&local_ec0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_66,(size_t)&local_ed0,
             msg_66);
  _Var6 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[6]>>
                    (strings.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     strings.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,"noban");
  local_528.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (_Var6._M_current !=
       strings.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish);
  local_528.m_message.px = (element_type *)0x0;
  local_528.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_540 = "std::find(strings.begin(), strings.end(), \"noban\") != strings.end()";
  local_538 = "";
  local_1c8[8] = false;
  local_1c8._0_8_ = &PTR__lazy_ostream_0113a070;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = &local_540;
  local_ee0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_ed8 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_528,(lazy_ostream *)local_1c8,1,0,WARN,(check_type)ppcVar19,(size_t)&local_ee0,
             0x1d8);
  boost::detail::shared_count::~shared_count(&local_528.m_message.pn);
  local_ef0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_ee8 = "";
  local_f00 = &boost::unit_test::basic_cstring<char_const>::null;
  local_ef8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_67.m_end = pvVar8;
  msg_67.m_begin = pvVar7;
  file_67.m_end = (iterator)0x1d9;
  file_67.m_begin = (iterator)&local_ef0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_67,(size_t)&local_f00,
             msg_67);
  _Var6 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[8]>>
                    (strings.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     strings.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,"mempool");
  local_528.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (_Var6._M_current !=
       strings.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish);
  local_528.m_message.px = (element_type *)0x0;
  local_528.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_540 = "std::find(strings.begin(), strings.end(), \"mempool\") != strings.end()";
  local_538 = "";
  local_1c8[8] = false;
  local_1c8._0_8_ = &PTR__lazy_ostream_0113a070;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = &local_540;
  local_f10 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_f08 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_528,(lazy_ostream *)local_1c8,1,0,WARN,(check_type)ppcVar19,(size_t)&local_f10,
             0x1d9);
  boost::detail::shared_count::~shared_count(&local_528.m_message.pn);
  local_f20 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_f18 = "";
  local_f30 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f28 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_68.m_end = pvVar8;
  msg_68.m_begin = pvVar7;
  file_68.m_end = (iterator)0x1da;
  file_68.m_begin = (iterator)&local_f20;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_68,(size_t)&local_f30,
             msg_68);
  _Var6 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[9]>>
                    (strings.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     strings.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,"download");
  local_528.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (_Var6._M_current !=
       strings.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish);
  local_528.m_message.px = (element_type *)0x0;
  local_528.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_540 = "std::find(strings.begin(), strings.end(), \"download\") != strings.end()";
  local_538 = "";
  local_1c8[8] = false;
  local_1c8._0_8_ = &PTR__lazy_ostream_0113a070;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = &local_540;
  local_f40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_f38 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_528,(lazy_ostream *)local_1c8,1,0,WARN,(check_type)ppcVar19,(size_t)&local_f40,
             0x1da);
  boost::detail::shared_count::~shared_count(&local_528.m_message.pn);
  local_f50 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_f48 = "";
  local_f60 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f58 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_69.m_end = pvVar8;
  msg_69.m_begin = pvVar7;
  file_69.m_end = (iterator)0x1db;
  file_69.m_begin = (iterator)&local_f50;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_69,(size_t)&local_f60,
             msg_69);
  _Var6 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[5]>>
                    (strings.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     strings.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,"addr");
  local_528.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)
       (_Var6._M_current !=
       strings.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish);
  local_528.m_message.px = (element_type *)0x0;
  local_528.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_540 = "std::find(strings.begin(), strings.end(), \"addr\") != strings.end()";
  local_538 = "";
  local_1c8[8] = false;
  local_1c8._0_8_ = &PTR__lazy_ostream_0113a070;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = &local_540;
  local_f70 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_f68 = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_528,(lazy_ostream *)local_1c8,1,0,WARN,(check_type)ppcVar19,(size_t)&local_f70,
             0x1db);
  boost::detail::shared_count::~shared_count(&local_528.m_message.pn);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&strings);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&download.m_service);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&download_noban.m_service);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&noban_download.m_service);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&noban.m_service);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&whitelistPermissions.m_subnet);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&whitebindPermissions.m_service);
  bilingual_str::~bilingual_str(&error);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(netpermissions_test)
{
    bilingual_str error;
    NetWhitebindPermissions whitebindPermissions;
    NetWhitelistPermissions whitelistPermissions;
    ConnectionDirection connection_direction;

    // Detect invalid white bind
    BOOST_CHECK(!NetWhitebindPermissions::TryParse("", whitebindPermissions, error));
    BOOST_CHECK(error.original.find("Cannot resolve -whitebind address") != std::string::npos);
    BOOST_CHECK(!NetWhitebindPermissions::TryParse("127.0.0.1", whitebindPermissions, error));
    BOOST_CHECK(error.original.find("Need to specify a port with -whitebind") != std::string::npos);
    BOOST_CHECK(!NetWhitebindPermissions::TryParse("", whitebindPermissions, error));

    // If no permission flags, assume backward compatibility
    BOOST_CHECK(NetWhitebindPermissions::TryParse("1.2.3.4:32", whitebindPermissions, error));
    BOOST_CHECK(error.empty());
    BOOST_CHECK_EQUAL(whitebindPermissions.m_flags, NetPermissionFlags::Implicit);
    BOOST_CHECK(NetPermissions::HasFlag(whitebindPermissions.m_flags, NetPermissionFlags::Implicit));
    NetPermissions::ClearFlag(whitebindPermissions.m_flags, NetPermissionFlags::Implicit);
    BOOST_CHECK(!NetPermissions::HasFlag(whitebindPermissions.m_flags, NetPermissionFlags::Implicit));
    BOOST_CHECK_EQUAL(whitebindPermissions.m_flags, NetPermissionFlags::None);
    NetPermissions::AddFlag(whitebindPermissions.m_flags, NetPermissionFlags::Implicit);
    BOOST_CHECK(NetPermissions::HasFlag(whitebindPermissions.m_flags, NetPermissionFlags::Implicit));

    // Can set one permission
    BOOST_CHECK(NetWhitebindPermissions::TryParse("bloom@1.2.3.4:32", whitebindPermissions, error));
    BOOST_CHECK_EQUAL(whitebindPermissions.m_flags, NetPermissionFlags::BloomFilter);
    BOOST_CHECK(NetWhitebindPermissions::TryParse("@1.2.3.4:32", whitebindPermissions, error));
    BOOST_CHECK_EQUAL(whitebindPermissions.m_flags, NetPermissionFlags::None);

    NetWhitebindPermissions noban, noban_download, download_noban, download;

    // "noban" implies "download"
    BOOST_REQUIRE(NetWhitebindPermissions::TryParse("noban@1.2.3.4:32", noban, error));
    BOOST_CHECK_EQUAL(noban.m_flags, NetPermissionFlags::NoBan);
    BOOST_CHECK(NetPermissions::HasFlag(noban.m_flags, NetPermissionFlags::Download));
    BOOST_CHECK(NetPermissions::HasFlag(noban.m_flags, NetPermissionFlags::NoBan));

    // "noban,download" is equivalent to "noban"
    BOOST_REQUIRE(NetWhitebindPermissions::TryParse("noban,download@1.2.3.4:32", noban_download, error));
    BOOST_CHECK_EQUAL(noban_download.m_flags, noban.m_flags);

    // "download,noban" is equivalent to "noban"
    BOOST_REQUIRE(NetWhitebindPermissions::TryParse("download,noban@1.2.3.4:32", download_noban, error));
    BOOST_CHECK_EQUAL(download_noban.m_flags, noban.m_flags);

    // "download" excludes (does not imply) "noban"
    BOOST_REQUIRE(NetWhitebindPermissions::TryParse("download@1.2.3.4:32", download, error));
    BOOST_CHECK_EQUAL(download.m_flags, NetPermissionFlags::Download);
    BOOST_CHECK(NetPermissions::HasFlag(download.m_flags, NetPermissionFlags::Download));
    BOOST_CHECK(!NetPermissions::HasFlag(download.m_flags, NetPermissionFlags::NoBan));

    // Happy path, can parse flags
    BOOST_CHECK(NetWhitebindPermissions::TryParse("bloom,forcerelay@1.2.3.4:32", whitebindPermissions, error));
    // forcerelay should also activate the relay permission
    BOOST_CHECK_EQUAL(whitebindPermissions.m_flags, NetPermissionFlags::BloomFilter | NetPermissionFlags::ForceRelay | NetPermissionFlags::Relay);
    BOOST_CHECK(NetWhitebindPermissions::TryParse("bloom,relay,noban@1.2.3.4:32", whitebindPermissions, error));
    BOOST_CHECK_EQUAL(whitebindPermissions.m_flags, NetPermissionFlags::BloomFilter | NetPermissionFlags::Relay | NetPermissionFlags::NoBan);
    BOOST_CHECK(NetWhitebindPermissions::TryParse("bloom,forcerelay,noban@1.2.3.4:32", whitebindPermissions, error));
    BOOST_CHECK(NetWhitebindPermissions::TryParse("all@1.2.3.4:32", whitebindPermissions, error));
    BOOST_CHECK_EQUAL(whitebindPermissions.m_flags, NetPermissionFlags::All);

    // Allow dups
    BOOST_CHECK(NetWhitebindPermissions::TryParse("bloom,relay,noban,noban@1.2.3.4:32", whitebindPermissions, error));
    BOOST_CHECK_EQUAL(whitebindPermissions.m_flags, NetPermissionFlags::BloomFilter | NetPermissionFlags::Relay | NetPermissionFlags::NoBan | NetPermissionFlags::Download); // "noban" implies "download"

    // Allow empty
    BOOST_CHECK(NetWhitebindPermissions::TryParse("bloom,relay,,noban@1.2.3.4:32", whitebindPermissions, error));
    BOOST_CHECK_EQUAL(whitebindPermissions.m_flags, NetPermissionFlags::BloomFilter | NetPermissionFlags::Relay | NetPermissionFlags::NoBan);
    BOOST_CHECK(NetWhitebindPermissions::TryParse(",@1.2.3.4:32", whitebindPermissions, error));
    BOOST_CHECK_EQUAL(whitebindPermissions.m_flags, NetPermissionFlags::None);
    BOOST_CHECK(NetWhitebindPermissions::TryParse(",,@1.2.3.4:32", whitebindPermissions, error));
    BOOST_CHECK_EQUAL(whitebindPermissions.m_flags, NetPermissionFlags::None);

    BOOST_CHECK(!NetWhitebindPermissions::TryParse("out,forcerelay@1.2.3.4:32", whitebindPermissions, error));
    BOOST_CHECK(error.original.find("whitebind may only be used for incoming connections (\"out\" was passed)") != std::string::npos);

    // Detect invalid flag
    BOOST_CHECK(!NetWhitebindPermissions::TryParse("bloom,forcerelay,oopsie@1.2.3.4:32", whitebindPermissions, error));
    BOOST_CHECK(error.original.find("Invalid P2P permission") != std::string::npos);

    // Check netmask error
    BOOST_CHECK(!NetWhitelistPermissions::TryParse("bloom,forcerelay,noban@1.2.3.4:32", whitelistPermissions, connection_direction, error));
    BOOST_CHECK(error.original.find("Invalid netmask specified in -whitelist") != std::string::npos);

    // Happy path for whitelist parsing
    BOOST_CHECK(NetWhitelistPermissions::TryParse("noban@1.2.3.4", whitelistPermissions, connection_direction, error));
    BOOST_CHECK_EQUAL(whitelistPermissions.m_flags, NetPermissionFlags::NoBan);
    BOOST_CHECK(NetPermissions::HasFlag(whitelistPermissions.m_flags, NetPermissionFlags::NoBan));

    BOOST_CHECK(NetWhitelistPermissions::TryParse("bloom,forcerelay,noban,relay@1.2.3.4/32", whitelistPermissions, connection_direction, error));
    BOOST_CHECK_EQUAL(whitelistPermissions.m_flags, NetPermissionFlags::BloomFilter | NetPermissionFlags::ForceRelay | NetPermissionFlags::NoBan | NetPermissionFlags::Relay);
    BOOST_CHECK(error.empty());
    BOOST_CHECK_EQUAL(whitelistPermissions.m_subnet.ToString(), "1.2.3.4/32");
    BOOST_CHECK(NetWhitelistPermissions::TryParse("bloom,forcerelay,noban,relay,mempool@1.2.3.4/32", whitelistPermissions, connection_direction, error));
    BOOST_CHECK(NetWhitelistPermissions::TryParse("in,relay@1.2.3.4", whitelistPermissions, connection_direction, error));
    BOOST_CHECK_EQUAL(connection_direction, ConnectionDirection::In);
    BOOST_CHECK(NetWhitelistPermissions::TryParse("out,bloom@1.2.3.4", whitelistPermissions, connection_direction, error));
    BOOST_CHECK_EQUAL(connection_direction, ConnectionDirection::Out);
    BOOST_CHECK(NetWhitelistPermissions::TryParse("in,out,bloom@1.2.3.4", whitelistPermissions, connection_direction, error));
    BOOST_CHECK_EQUAL(connection_direction, ConnectionDirection::Both);

    const auto strings = NetPermissions::ToStrings(NetPermissionFlags::All);
    BOOST_CHECK_EQUAL(strings.size(), 7U);
    BOOST_CHECK(std::find(strings.begin(), strings.end(), "bloomfilter") != strings.end());
    BOOST_CHECK(std::find(strings.begin(), strings.end(), "forcerelay") != strings.end());
    BOOST_CHECK(std::find(strings.begin(), strings.end(), "relay") != strings.end());
    BOOST_CHECK(std::find(strings.begin(), strings.end(), "noban") != strings.end());
    BOOST_CHECK(std::find(strings.begin(), strings.end(), "mempool") != strings.end());
    BOOST_CHECK(std::find(strings.begin(), strings.end(), "download") != strings.end());
    BOOST_CHECK(std::find(strings.begin(), strings.end(), "addr") != strings.end());
}